

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O3

void nn_fsm_stopped(nn_fsm *self,int type)

{
  if (self->state == 3) {
    (self->stopped).fsm = self->owner;
    (self->stopped).src = self->src;
    (self->stopped).srcptr = self->srcptr;
    (self->stopped).type = type;
    nn_ctx_raise(self->ctx,&self->stopped);
    self->state = 1;
    return;
  }
  nn_fsm_stopped_cold_1();
}

Assistant:

void nn_fsm_stopped (struct nn_fsm *self, int type)
{
    nn_assert_state (self, NN_FSM_STATE_STOPPING);
    nn_fsm_raise (self, &self->stopped, type);
    self->state = NN_FSM_STATE_IDLE;
}